

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

void fct_dotted_line_start(size_t maxwidth,char *startwith)

{
  size_t sVar1;
  size_t __n;
  char line [256];
  char local_118 [64];
  uint local_d8;
  
  builtin_strncpy(local_118 + 0x30,"................",0x10);
  builtin_strncpy(local_118 + 0x20,"................",0x10);
  builtin_strncpy(local_118 + 0x10,"................",0x10);
  builtin_strncpy(local_118,"................",0x10);
  local_d8 = 0x2e2e2e2e;
  sVar1 = strlen((char *)maxwidth);
  __n = 0x43;
  if (sVar1 < 0x43) {
    __n = sVar1;
  }
  memcpy(local_118,(void *)maxwidth,__n);
  if (sVar1 < 0x43) {
    local_118[sVar1] = ' ';
  }
  local_d8 = local_d8 & 0xffffff;
  fputs(local_118,_stdout);
  return;
}

Assistant:

static void
fct_dotted_line_start(size_t maxwidth, char const *startwith)
{
    char line[FCT_DOTTED_MAX_LEN];
    size_t len =0;
    size_t line_len =0;

    memset(line, '.', sizeof(char)*maxwidth);
    len = strlen(startwith);
    line_len = FCTMIN(maxwidth-1, len);
    memcpy(line, startwith, sizeof(char)*line_len);
    if ( len < maxwidth-1)
    {
        line[len] = ' ';
    }
    line[maxwidth-1] = '\0';
    fputs(line, stdout);
}